

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  i64 in_RAX;
  long i;
  i64 local_18;
  
  uVar2 = (uint)pMem->flags;
  if ((pMem->flags & 0x2d) != 0) goto LAB_0016eb2a;
  local_18 = in_RAX;
  uVar2 = sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
  if ((uVar2 < 2) && (iVar3 = sqlite3Atoi64(pMem->z,&local_18,pMem->n,pMem->enc), iVar3 < 2)) {
LAB_0016eb0e:
    (pMem->u).i = local_18;
    uVar1 = 4;
  }
  else {
    i = (long)(pMem->u).r;
    iVar3 = sqlite3RealSameAsInt((pMem->u).r,i);
    local_18 = i;
    if (iVar3 != 0) goto LAB_0016eb0e;
    uVar1 = 8;
  }
  uVar2 = (uint)uVar1 | pMem->flags & 0x3e40;
LAB_0016eb2a:
  pMem->flags = (u16)(uVar2 & 0xbfed);
  return uVar2 & 0xbfed;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  testcase( pMem->flags & MEM_Int );
  testcase( pMem->flags & MEM_Real );
  testcase( pMem->flags & MEM_IntReal );
  testcase( pMem->flags & MEM_Null );
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null))==0 ){
    int rc;
    sqlite3_int64 ix;
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    rc = sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc);
    if( ((rc==0 || rc==1) && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)<=1)
     || sqlite3RealSameAsInt(pMem->u.r, (ix = (i64)pMem->u.r))
    ){
      pMem->u.i = ix;
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      MemSetTypeFlag(pMem, MEM_Real);
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob|MEM_Zero);
  return SQLITE_OK;
}